

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

ParseStackGenericElement * __thiscall
SGParser::Parse<SGParser::ParseStackGenericElement>::operator[]
          (Parse<SGParser::ParseStackGenericElement> *this,IndexType index)

{
  IndexType IVar1;
  IndexType index_local;
  Parse<SGParser::ParseStackGenericElement> *this_local;
  
  if ((long)this->StackPosition < -index) {
    __assert_fail("-index <= IndexType(StackPosition)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                  ,0xc4,
                  "StackElement &SGParser::Parse<SGParser::ParseStackGenericElement>::operator[](IndexType)"
                 );
  }
  IVar1 = GetMaxAllowedIndex(this);
  if (index < IVar1) {
    return this->pStack + this->StackPosition + index;
  }
  __assert_fail("index < GetMaxAllowedIndex()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                ,0xc5,
                "StackElement &SGParser::Parse<SGParser::ParseStackGenericElement>::operator[](IndexType)"
               );
}

Assistant:

StackElement&       operator[](IndexType index) {
        SG_ASSERT(-index <= IndexType(StackPosition));
        SG_ASSERT(index < GetMaxAllowedIndex());
        return pStack[StackPosition + index];
    }